

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.cpp
# Opt level: O0

string * __thiscall amrex::Parser::expr_abi_cxx11_(Parser *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr *in_RSI;
  string *in_RDI;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if ((bVar1) &&
     (peVar2 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18ba3d9), peVar2->m_parser != (amrex_parser *)0x0)) {
    peVar2 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18ba3ea);
    std::__cxx11::string::string((string *)in_RDI,(string *)peVar2);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string
Parser::expr () const
{
    if (m_data && m_data->m_parser) {
        return m_data->m_expression;
    } else {
        return std::string{};
    }
}